

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_expr.cpp
# Opt level: O1

any * Omega_h::anon_unknown_41::lt(any *__return_storage_ptr__,any *lhs,any *rhs)

{
  int *piVar1;
  double dVar2;
  char *pcVar3;
  ulong *puVar4;
  Alloc *pAVar5;
  bool bVar6;
  int iVar7;
  type_info *ptVar8;
  ParserFail *this;
  undefined8 *puVar9;
  Read<double> local_68;
  Read<double> local_58;
  undefined1 local_48 [32];
  double local_28;
  
  if (lhs->vtable == (vtable_type *)0x0) {
    ptVar8 = (type_info *)&void::typeinfo;
  }
  else {
    ptVar8 = (*lhs->vtable->type)();
  }
  pcVar3 = *(char **)(ptVar8 + 8);
  if ((pcVar3 == _rfind) || ((*pcVar3 != '*' && (iVar7 = strcmp(pcVar3,_rfind), iVar7 == 0)))) {
    bVar6 = any::is_typed(lhs,(type_info *)&double::typeinfo);
    if (bVar6) {
      local_28 = *(double *)&lhs->storage;
      bVar6 = any::is_typed(rhs,(type_info *)&double::typeinfo);
      if (bVar6) {
        dVar2 = *(double *)&rhs->storage;
        __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<bool>()::table;
        *(bool *)&__return_storage_ptr__->storage = local_28 < dVar2;
        return __return_storage_ptr__;
      }
    }
  }
  else {
    if (lhs->vtable == (vtable_type *)0x0) {
      ptVar8 = (type_info *)&void::typeinfo;
    }
    else {
      ptVar8 = (*lhs->vtable->type)();
    }
    pcVar3 = *(char **)(ptVar8 + 8);
    if ((pcVar3 != "N7Omega_h4ReadIdEE") &&
       ((*pcVar3 == '*' || (iVar7 = strcmp(pcVar3,"N7Omega_h4ReadIdEE"), iVar7 != 0)))) {
      this = (ParserFail *)__cxa_allocate_exception(0x10);
      local_48._0_8_ = local_48 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_48,"Invalid operand types to < operator","");
      ParserFail::ParserFail(this,(string *)local_48);
      __cxa_throw(this,&ParserFail::typeinfo,std::invalid_argument::~invalid_argument);
    }
    bVar6 = any::is_typed(lhs,(type_info *)&Read<double>::typeinfo);
    puVar4 = (ulong *)(lhs->storage).dynamic;
    if (bVar6 && puVar4 != (ulong *)0x0) {
      local_68.write_.shared_alloc_.alloc = (Alloc *)*puVar4;
      if (((ulong)local_68.write_.shared_alloc_.alloc & 7) == 0 &&
          local_68.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_68.write_.shared_alloc_.alloc =
               (Alloc *)((local_68.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_68.write_.shared_alloc_.alloc)->use_count =
               (local_68.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_68.write_.shared_alloc_.direct_ptr = (void *)puVar4[1];
      bVar6 = any::is_typed(rhs,(type_info *)&Read<double>::typeinfo);
      puVar4 = (ulong *)(rhs->storage).dynamic;
      if (bVar6 && puVar4 != (ulong *)0x0) {
        local_58.write_.shared_alloc_.alloc = (Alloc *)*puVar4;
        if (((ulong)local_58.write_.shared_alloc_.alloc & 7) == 0 &&
            local_58.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_58.write_.shared_alloc_.alloc =
                 (Alloc *)((local_58.write_.shared_alloc_.alloc)->size * 8 + 1);
          }
          else {
            (local_58.write_.shared_alloc_.alloc)->use_count =
                 (local_58.write_.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_58.write_.shared_alloc_.direct_ptr = (void *)puVar4[1];
        lt_each<double>((Omega_h *)local_48,&local_68,&local_58);
        __return_storage_ptr__->vtable =
             (vtable_type *)any::vtable_for_type<Omega_h::Read<signed_char>>()::table;
        any::do_construct<Omega_h::Read<signed_char>,Omega_h::Read<signed_char>>
                  (__return_storage_ptr__,(Read<signed_char> *)local_48);
        if ((local_48._0_8_ & 7) == 0 && (Alloc *)local_48._0_8_ != (Alloc *)0x0) {
          piVar1 = (int *)(local_48._0_8_ + 0x30);
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc((Alloc *)local_48._0_8_);
            operator_delete((void *)local_48._0_8_,0x48);
          }
        }
        pAVar5 = local_58.write_.shared_alloc_.alloc;
        if (((ulong)local_58.write_.shared_alloc_.alloc & 7) == 0 &&
            local_58.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_58.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_58.write_.shared_alloc_.alloc);
            operator_delete(pAVar5,0x48);
          }
        }
        pAVar5 = local_68.write_.shared_alloc_.alloc;
        if (((ulong)local_68.write_.shared_alloc_.alloc & 7) == 0 &&
            local_68.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_68.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_68.write_.shared_alloc_.alloc);
            operator_delete(pAVar5,0x48);
          }
        }
        return __return_storage_ptr__;
      }
      puVar9 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar9 = &PTR__bad_cast_004c4678;
      __cxa_throw(puVar9,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
    }
  }
  puVar9 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar9 = &PTR__bad_cast_004c4678;
  __cxa_throw(puVar9,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
}

Assistant:

any lt(any& lhs, any& rhs) {
  if (lhs.type() == typeid(Real)) {
    return any_cast<Real>(lhs) < any_cast<Real>(rhs);
  } else if (lhs.type() == typeid(Reals)) {
    return lt_each(any_cast<Reals>(lhs), any_cast<Reals>(rhs));
  } else {
    throw ParserFail("Invalid operand types to < operator");
  }
}